

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_sqrt_sort_build_blocks(int **arr,int L,int K)

{
  int in_EDX;
  int iVar1;
  int in_ESI;
  long in_RDI;
  int p;
  int restk;
  int rest;
  int p1;
  int p0;
  int h;
  int u;
  int m;
  int local_30;
  int local_20;
  int local_1c;
  uint local_18;
  int local_14;
  long local_8;
  
  for (local_14 = 1; local_14 < in_ESI; local_14 = local_14 + 2) {
    local_18 = (uint)(0 < **(int **)(in_RDI + (long)(local_14 + -1) * 8) -
                          **(int **)(in_RDI + (long)local_14 * 8));
    *(undefined8 *)(in_RDI + (long)(local_14 + -3) * 8) =
         *(undefined8 *)(in_RDI + (long)(int)(local_14 + -1 + local_18) * 8);
    *(undefined8 *)(in_RDI + (long)(local_14 + -2) * 8) =
         *(undefined8 *)(in_RDI + (long)(int)(local_14 - local_18) * 8);
  }
  if (in_ESI % 2 != 0) {
    *(undefined8 *)(in_RDI + (long)(in_ESI + -3) * 8) =
         *(undefined8 *)(in_RDI + (long)(in_ESI + -1) * 8);
  }
  local_8 = in_RDI + -0x10;
  for (local_1c = 2; local_1c < in_EDX; local_1c = local_1c << 1) {
    for (local_20 = 0; local_20 <= in_ESI + local_1c * -2; local_20 = local_1c * 2 + local_20) {
      stable_sqrt_sort_merge_left_with_x_buf
                ((int **)(local_8 + (long)local_20 * 8),local_1c,local_1c,-local_1c);
    }
    if (local_1c < in_ESI - local_20) {
      stable_sqrt_sort_merge_left_with_x_buf
                ((int **)(local_8 + (long)local_20 * 8),local_1c,(in_ESI - local_20) - local_1c,
                 -local_1c);
    }
    else {
      for (; local_20 < in_ESI; local_20 = local_20 + 1) {
        *(undefined8 *)(local_8 + (long)(local_20 - local_1c) * 8) =
             *(undefined8 *)(local_8 + (long)local_20 * 8);
      }
    }
    local_8 = local_8 + (long)local_1c * -8;
  }
  iVar1 = in_ESI % (in_EDX << 1);
  local_30 = in_ESI - iVar1;
  if (in_EDX < iVar1) {
    stable_sqrt_sort_merge_right
              ((int **)(local_8 + (long)local_30 * 8),in_EDX,iVar1 - in_EDX,in_EDX);
  }
  else {
    memcpy((void *)(local_8 + (long)local_30 * 8 + (long)in_EDX * 8),
           (void *)(local_8 + (long)local_30 * 8),(long)iVar1 << 3);
  }
  while (0 < local_30) {
    local_30 = local_30 + in_EDX * -2;
    stable_sqrt_sort_merge_right((int **)(local_8 + (long)local_30 * 8),in_EDX,in_EDX,in_EDX);
  }
  return;
}

Assistant:

static void SQRT_SORT_BUILD_BLOCKS(SORT_TYPE *arr, int L, int K) {
  int m, u, h, p0, p1, rest, restk, p;

  for (m = 1; m < L; m += 2) {
    u = 0;

    if (SORT_CMP_A(arr + (m - 1), arr + m) > 0) {
      u = 1;
    }

    arr[m - 3] = arr[m - 1 + u];
    arr[m - 2] = arr[m - u];
  }

  if (L % 2) {
    arr[L - 3] = arr[L - 1];
  }

  arr -= 2;

  for (h = 2; h < K; h *= 2) {
    p0 = 0;
    p1 = L - 2 * h;

    while (p0 <= p1) {
      SQRT_SORT_MERGE_LEFT_WITH_X_BUF(arr + p0, h, h, -h);
      p0 += 2 * h;
    }

    rest = L - p0;

    if (rest > h) {
      SQRT_SORT_MERGE_LEFT_WITH_X_BUF(arr + p0, h, rest - h, -h);
    } else {
      for (; p0 < L; p0++) {
        arr[p0 - h] = arr[p0];
      }
    }

    arr -= h;
  }

  restk = L % (2 * K);
  p = L - restk;

  if (restk <= K) {
    SORT_TYPE_CPY(arr + p + K, arr + p, restk);
  } else {
    SQRT_SORT_MERGE_RIGHT(arr + p, K, restk - K, K);
  }

  while (p > 0) {
    p -= 2 * K;
    SQRT_SORT_MERGE_RIGHT(arr + p, K, K, K);
  }
}